

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_driver.cpp
# Opt level: O3

void __thiscall
MC::MC_Driver::addIndexParam(MC_Driver *this,string *indexName,string *tableName,string *colunmName)

{
  std::__cxx11::string::_M_assign((string *)&this->indexInfo->indexName);
  std::__cxx11::string::_M_assign((string *)&this->indexInfo->tableName);
  std::__cxx11::string::_M_assign((string *)&this->indexInfo->colunmName);
  return;
}

Assistant:

void MC::MC_Driver::addIndexParam(std::string indexName, std::string tableName, std::string colunmName){
    indexInfo->indexName = indexName;
    indexInfo->tableName = tableName;
    indexInfo->colunmName = colunmName;
}